

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O1

void __thiscall cmDependsC::TransformLine(cmDependsC *this,string *line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  iterator iVar3;
  char *pcVar4;
  string newline;
  string arg;
  key_type local_60;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  
  bVar2 = cmsys::RegularExpression::find(&this->IncludeRegexTransform,(line->_M_dataplus)._M_p);
  if (bVar2) {
    pcVar4 = (this->IncludeRegexTransform).startp[3];
    if (pcVar4 == (char *)0x0) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      local_60._M_string_length = 0;
      local_60.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,pcVar4,(this->IncludeRegexTransform).endp[3]);
    }
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->TransformRules)._M_t,&local_60);
    paVar1 = &local_60.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
    }
    if ((_Rb_tree_header *)iVar3._M_node !=
        &(this->TransformRules)._M_t._M_impl.super__Rb_tree_header) {
      pcVar4 = (this->IncludeRegexTransform).startp[1];
      local_60._M_dataplus._M_p = (pointer)paVar1;
      if (pcVar4 == (char *)0x0) {
        local_60._M_string_length = 0;
        local_60.field_2._M_local_buf[0] = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,pcVar4,(this->IncludeRegexTransform).endp[1]);
      }
      pcVar4 = (this->IncludeRegexTransform).startp[4];
      if (pcVar4 == (char *)0x0) {
        local_40 = &local_30;
        local_38 = 0;
        local_30 = 0;
      }
      else {
        local_40 = &local_30;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,pcVar4,(this->IncludeRegexTransform).endp[4]);
      }
      pcVar4 = *(char **)(iVar3._M_node + 2);
      do {
        if (*pcVar4 == '%') {
          std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_40);
        }
        else {
          if (*pcVar4 == '\0') {
            std::__cxx11::string::_M_assign((string *)line);
            if (local_40 != &local_30) {
              operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p == paVar1) {
              return;
            }
            operator_delete(local_60._M_dataplus._M_p,
                            CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                     local_60.field_2._M_local_buf[0]) + 1);
            return;
          }
          std::__cxx11::string::push_back((char)&local_60);
        }
        pcVar4 = pcVar4 + 1;
      } while( true );
    }
  }
  return;
}

Assistant:

void cmDependsC::TransformLine(std::string& line)
{
  // Check for a transform rule match.  Return if none.
  if(!this->IncludeRegexTransform.find(line.c_str()))
    {
    return;
    }
  TransformRulesType::const_iterator tri =
    this->TransformRules.find(this->IncludeRegexTransform.match(3));
  if(tri == this->TransformRules.end())
    {
    return;
    }

  // Construct the transformed line.
  std::string newline = this->IncludeRegexTransform.match(1);
  std::string arg = this->IncludeRegexTransform.match(4);
  for(const char* c = tri->second.c_str(); *c; ++c)
    {
    if(*c == '%')
      {
      newline += arg;
      }
    else
      {
      newline += *c;
      }
    }

  // Return the transformed line.
  line = newline;
}